

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadString_Binary(COBImporter *this,string *out,StreamReaderLE *reader)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  size_type sVar4;
  
  StreamReader<false,_false>::Get<short>(reader);
  std::__cxx11::string::resize((ulong)out);
  pcVar1 = (out->_M_dataplus)._M_p;
  sVar2 = out->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    cVar3 = StreamReader<false,_false>::Get<signed_char>(reader);
    pcVar1[sVar4] = cVar3;
  }
  return;
}

Assistant:

void COBImporter::ReadString_Binary(std::string& out, StreamReaderLE& reader)
{
    out.resize( reader.GetI2());
    for(char& c : out) {
        c = reader.GetI1();
    }
}